

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xxhash.c
# Opt level: O0

unsigned_long_long XXH64_digest(XXH64_state_t *state_in)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  BYTE *pBVar4;
  ulong uVar5;
  XXH_endianess endian_detected;
  XXH64_state_t *state_in_local;
  U64 k1_1;
  U64 v4_1;
  U64 v3_1;
  U64 v2_1;
  U64 v1_1;
  U64 h64_1;
  BYTE *bEnd_1;
  BYTE *p_1;
  XXH_istate64_t *state_1;
  U64 k1;
  U64 v4;
  U64 v3;
  U64 v2;
  U64 v1;
  U64 h64;
  BYTE *bEnd;
  BYTE *p;
  XXH_istate64_t *state;
  
  bEnd = (BYTE *)((long)state_in->ll + 0x34);
  pBVar4 = (BYTE *)((long)state_in->ll + (ulong)(uint)state_in->ll[6] + 0x34);
  if ((ulong)state_in->ll[0] < 0x20) {
    v1 = state_in->ll[1] + 0x27d4eb2f165667c5;
  }
  else {
    uVar5 = state_in->ll[2];
    uVar1 = state_in->ll[3];
    uVar2 = state_in->ll[4];
    uVar3 = state_in->ll[5];
    v1 = ((uVar3 * -0x6c158a5880000000 | uVar3 * -0x3d4d51c2d82b14b1 >> 0x21) * -0x61c8864e7a143579
         ^ ((uVar2 * -0x6c158a5880000000 | uVar2 * -0x3d4d51c2d82b14b1 >> 0x21) *
            -0x61c8864e7a143579 ^
           ((uVar1 * -0x6c158a5880000000 | uVar1 * -0x3d4d51c2d82b14b1 >> 0x21) *
            -0x61c8864e7a143579 ^
           ((uVar5 * -0x6c158a5880000000 | uVar5 * -0x3d4d51c2d82b14b1 >> 0x21) *
            -0x61c8864e7a143579 ^
           (uVar5 << 1 | uVar5 >> 0x3f) + (uVar1 << 7 | uVar1 >> 0x39) +
           (uVar2 << 0xc | uVar2 >> 0x34) + (uVar3 << 0x12 | uVar3 >> 0x2e)) * -0x61c8864e7a143579 +
           0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63) * -0x61c8864e7a143579 +
           0x85ebca77c2b2ae63) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  }
  v1 = state_in->ll[0] + v1;
  for (; bEnd + 8 <= pBVar4; bEnd = bEnd + 8) {
    uVar5 = (*(long *)bEnd * -0x6c158a5880000000 |
            (ulong)(*(long *)bEnd * -0x3d4d51c2d82b14b1) >> 0x21) * -0x61c8864e7a143579 ^ v1;
    v1 = (uVar5 << 0x1b | uVar5 >> 0x25) * -0x61c8864e7a143579 + 0x85ebca77c2b2ae63;
  }
  if (bEnd + 4 <= pBVar4) {
    uVar5 = (ulong)*(uint *)bEnd * -0x61c8864e7a143579 ^ v1;
    v1 = (uVar5 << 0x17 | uVar5 >> 0x29) * -0x3d4d51c2d82b14b1 + 0x165667b19e3779f9;
    bEnd = bEnd + 4;
  }
  for (; bEnd < pBVar4; bEnd = bEnd + 1) {
    uVar5 = (ulong)*bEnd * 0x27d4eb2f165667c5 ^ v1;
    v1 = (uVar5 << 0xb | uVar5 >> 0x35) * -0x61c8864e7a143579;
  }
  uVar5 = (v1 >> 0x21 ^ v1) * -0x3d4d51c2d82b14b1;
  uVar5 = (uVar5 >> 0x1d ^ uVar5) * 0x165667b19e3779f9;
  return uVar5 >> 0x20 ^ uVar5;
}

Assistant:

unsigned long long XXH64_digest(const XXH64_state_t *state_in) {
    XXH_endianess endian_detected = (XXH_endianess) XXH_CPU_LITTLE_ENDIAN;

    if ((endian_detected == XXH_littleEndian) || XXH_FORCE_NATIVE_FORMAT)
        return XXH64_digest_endian(state_in, XXH_littleEndian);
    else
        return XXH64_digest_endian(state_in, XXH_bigEndian);
}